

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

pair<long,_long> __thiscall
anurbs::NurbsSurfaceGeometry<2L>::span_at(NurbsSurfaceGeometry<2L> *this,double u,double v)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Index IVar2;
  pair<long,_long> pVar3;
  double local_58;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_50;
  double local_28;
  
  local_58 = v;
  local_28 = u;
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  knots_u(&local_50,this);
  pVar3.first = Nurbs::
                upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                          (CONCAT44(extraout_var,iVar1),&local_50,&local_28);
  free(local_50.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  knots_v(&local_50,this);
  IVar2 = Nurbs::
          upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var_00,iVar1),&local_50,&local_58);
  free(local_50.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  pVar3.second = IVar2;
  return pVar3;
}

Assistant:

std::pair<Index, Index> span_at(const double u, const double v) const
    {
        const auto span_u = Nurbs::upper_span(degree_u(), knots_u(), u);
        const auto span_v = Nurbs::upper_span(degree_v(), knots_v(), v);

        return {span_u, span_v};
    }